

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall Imf_3_4::TimeCode::setBinaryGroup(TimeCode *this,int group,int value)

{
  int minBit_00;
  ArgExc *this_00;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  int maxBit;
  int minBit;
  
  if ((0 < in_ESI) && (in_ESI < 9)) {
    minBit_00 = (in_ESI + -1) * 4;
    anon_unknown_1::setBitField((uint *)(in_RDI + 4),minBit_00,minBit_00 + 3,in_EDX);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (this_00,
             "Cannot extract binary group from time code user data.  Group number is out of range.")
  ;
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setBinaryGroup (int group, int value)
{
    if (group < 1 || group > 8)
        throw IEX_NAMESPACE::ArgExc (
            "Cannot extract binary group from time code "
            "user data.  Group number is out of range.");

    int minBit = 4 * (group - 1);
    int maxBit = minBit + 3;
    setBitField (_user, minBit, maxBit, (unsigned int) value);
}